

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::NoExecDeathTest::AssumeRole(NoExecDeathTest *this)

{
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  size_t sVar4;
  int *piVar5;
  UnitTestImpl *pUVar6;
  char *pcVar7;
  ostream *poVar8;
  TestRole TVar9;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  int local_70;
  int local_6c;
  int pipe_fd [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  int local_28;
  allocator<char> local_21;
  
  sVar4 = GetThreadCount();
  if (sVar4 != 1) {
    GTestLog::GTestLog((GTestLog *)&local_90,GTEST_WARNING,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                       ,0x450);
    Message::Message((Message *)&local_48);
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),
                    "Death tests use fork(), which is unsafe particularly");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),
                    " in a threaded context. For this test, ");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),"Google Test");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10)," ");
    poVar8 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
    if (sVar4 == 0) {
      pcVar7 = "couldn\'t detect the number of threads.";
    }
    else {
      std::operator<<(poVar8,"detected ");
      std::ostream::_M_insert<unsigned_long>((ulong)(local_48._M_dataplus._M_p + 0x10));
      poVar8 = (ostream *)(local_48._M_dataplus._M_p + 0x10);
      pcVar7 = " threads.";
    }
    std::operator<<(poVar8,pcVar7);
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),
                    " See https://github.com/google/googletest/blob/main/docs/advanced.md#death-tests-and-threads"
                   );
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),
                    " for more explanation and suggested solutions, especially if");
    std::operator<<((ostream *)(local_48._M_dataplus._M_p + 0x10),
                    " this is the last message you see before your test times out.");
    Message::GetString_abi_cxx11_((string *)pipe_fd,(Message *)&local_48);
    if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
    }
    std::operator<<((ostream *)&std::cerr,(string *)pipe_fd);
    std::__cxx11::string::~string((string *)pipe_fd);
    GTestLog::~GTestLog((GTestLog *)&local_90);
  }
  TVar9 = EXECUTE_TEST;
  do {
    iVar2 = pipe(&local_70);
    bVar1 = IsTrue(iVar2 != -1);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"CHECK failed: File ",(allocator<char> *)&local_28);
      std::operator+(&local_f0,&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_110,&local_f0,", line ");
      local_130._M_dataplus._M_p._0_4_ = 0x454;
      StreamableToString<int>(&local_b0,(int *)&local_130);
      std::operator+(&local_90,&local_110,&local_b0);
      std::operator+(&local_48,&local_90,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                     &local_48,"pipe(pipe_fd) != -1");
      DeathTestAbort((string *)pipe_fd);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)pipe_fd,"",(allocator<char> *)&local_48);
  DeathTest::set_last_death_test_message((string *)pipe_fd);
  std::__cxx11::string::~string((string *)pipe_fd);
  CaptureStderr();
  FlushInfoLog();
  _Var3 = fork();
  do {
    bVar1 = IsTrue(_Var3 != -1);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d0,"CHECK failed: File ",(allocator<char> *)&local_28);
      std::operator+(&local_f0,&local_d0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                    );
      std::operator+(&local_110,&local_f0,", line ");
      local_130._M_dataplus._M_p._0_4_ = 0x462;
      StreamableToString<int>(&local_b0,(int *)&local_130);
      std::operator+(&local_90,&local_110,&local_b0);
      std::operator+(&local_48,&local_90,": ");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pipe_fd,
                     &local_48,"child_pid != -1");
      DeathTestAbort((string *)pipe_fd);
    }
    bVar1 = AlwaysFalse();
  } while (bVar1);
  *(__pid_t *)&(this->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = _Var3;
  if (_Var3 == 0) {
    do {
      while( true ) {
        iVar2 = close(local_70);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"CHECK failed: File ",&local_21);
          std::operator+(&local_d0,&local_b0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_f0,&local_d0,", line ");
          local_28 = 0x465;
          StreamableToString<int>(&local_130,&local_28);
          std::operator+(&local_110,&local_f0,&local_130);
          std::operator+(&local_90,&local_110,": ");
          std::operator+(&local_48,&local_90,"close(pipe_fd[0])");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pipe_fd,&local_48," != -1");
          DeathTestAbort((string *)pipe_fd);
        }
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = local_6c;
    pUVar6 = GetUnitTestImpl();
    TestEventListeners::SuppressEventForwarding(&pUVar6->listeners_,true);
    g_in_fast_death_test_child = 1;
  }
  else {
    do {
      while( true ) {
        iVar2 = close(local_6c);
        if (iVar2 != -1) break;
        piVar5 = __errno_location();
        if (*piVar5 != 4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,"CHECK failed: File ",&local_21);
          std::operator+(&local_d0,&local_b0,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/vendor/googletest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_f0,&local_d0,", line ");
          local_28 = 0x471;
          StreamableToString<int>(&local_130,&local_28);
          std::operator+(&local_110,&local_f0,&local_130);
          std::operator+(&local_90,&local_110,": ");
          std::operator+(&local_48,&local_90,"close(pipe_fd[1])");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         pipe_fd,&local_48," != -1");
          DeathTestAbort((string *)pipe_fd);
        }
      }
      bVar1 = AlwaysFalse();
    } while (bVar1);
    (this->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = local_70;
    (this->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
    TVar9 = OVERSEE_TEST;
  }
  return TVar9;
}

Assistant:

DeathTest::TestRole NoExecDeathTest::AssumeRole() {
  const size_t thread_count = GetThreadCount();
  if (thread_count != 1) {
    GTEST_LOG_(WARNING) << DeathTestThreadWarning(thread_count);
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);

  DeathTest::set_last_death_test_message("");
  CaptureStderr();
  // When we fork the process below, the log file buffers are copied, but the
  // file descriptors are shared.  We flush all log files here so that closing
  // the file descriptors in the child process doesn't throw off the
  // synchronization between descriptors and buffers in the parent process.
  // This is as close to the fork as possible to avoid a race condition in case
  // there are multiple threads running before the death test, and another
  // thread writes to the log file.
  FlushInfoLog();

  const pid_t child_pid = fork();
  GTEST_DEATH_TEST_CHECK_(child_pid != -1);
  set_child_pid(child_pid);
  if (child_pid == 0) {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[0]));
    set_write_fd(pipe_fd[1]);
    // Redirects all logging to stderr in the child process to prevent
    // concurrent writes to the log files.  We capture stderr in the parent
    // process and append the child process' output to a log.
    LogToStderr();
    // Event forwarding to the listeners of event listener API mush be shut
    // down in death test subprocesses.
    GetUnitTestImpl()->listeners()->SuppressEventForwarding(true);
    g_in_fast_death_test_child = true;
    return EXECUTE_TEST;
  } else {
    GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
    set_read_fd(pipe_fd[0]);
    set_spawned(true);
    return OVERSEE_TEST;
  }
}